

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

bool __thiscall
nitro::options::parser::
try_parse_as_option<std::map<std::__cxx11::string,nitro::options::option*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nitro::options::option*>>>,__gnu_cxx::__normal_iterator<nitro::options::user_input_const*,std::vector<nitro::options::user_input,std::allocator<nitro::options::user_input>>>>
          (parser *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::option_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::option_*>_>_>
          *options,__normal_iterator<const_nitro::options::user_input_*,_std::vector<nitro::options::user_input,_std::allocator<nitro::options::user_input>_>_>
                   *it,
          __normal_iterator<const_nitro::options::user_input_*,_std::vector<nitro::options::user_input,_std::allocator<nitro::options::user_input>_>_>
          end)

{
  user_input *puVar1;
  char cVar2;
  _Rb_tree_node_base *p_Var3;
  
  p_Var3 = (options->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var3 == &(options->_M_t)._M_impl.super__Rb_tree_header) {
      return false;
    }
    cVar2 = (**(code **)(**(long **)(p_Var3 + 2) + 0x28))(*(long **)(p_Var3 + 2),it->_M_current);
    if (cVar2 != '\0') break;
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  puVar1 = it->_M_current;
  if ((*(puVar1->name_)._M_dataplus._M_p == '-') &&
     ((puVar1->value_).data_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    if ((puVar1 + 1 == end._M_current) || (*puVar1[1].name_._M_dataplus._M_p == '-')) {
      except::raise<nitro::options::parsing_error,char_const(&)[36],std::__cxx11::string_const&>
                ((char (*) [36])"missing value for required option: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)(p_Var3 + 2) + 8));
    }
    (**(code **)(**(long **)(p_Var3 + 2) + 0x30))(*(long **)(p_Var3 + 2),puVar1 + 1);
    it->_M_current = it->_M_current + 1;
  }
  else {
    (**(code **)(**(long **)(p_Var3 + 2) + 0x30))();
  }
  return true;
}

Assistant:

bool parser::try_parse_as_option(Options&& options, Iter& it, Iter end)
    {
        for (auto& option : options)
        {
            if (option.second->matches(*it))
            {
                if (it->has_value())
                {
                    option.second->update_value(*it);
                }
                else
                {
                    auto next = it + 1;

                    if (next != end && next->is_value())
                    {
                        option.second->update_value(*next);
                    }
                    else
                    {
                        raise<parsing_error>("missing value for required option: ",
                                             option.second->name());
                    }

                    ++it;
                }

                return true;
            }
        }

        return false;
    }